

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

int Au_NtkSuppSizeTest(Au_Ntk_t *p)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  if ((p->vObjs).nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if ((p->vObjs).nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = (p->vObjs).pArray[lVar6];
      pvVar2 = (p->vPages).pArray[(int)uVar1 >> 0xc];
      uVar4 = (ulong)((uVar1 & 0xfff) << 4);
      if ((~*(ulong *)((long)pvVar2 + uVar4) & 0x700000000) == 0) {
        iVar3 = Au_ObjSuppSize((Au_Obj_t *)((long)pvVar2 + uVar4));
        uVar5 = uVar5 + (iVar3 < 0x11);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vObjs).nSize);
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar5,(ulong)(uint)p->nObjs[7]);
  return uVar5;
}

Assistant:

int Au_NtkSuppSizeTest( Au_Ntk_t * p )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    Au_NtkForEachObj( p, pObj, i )
        if ( Au_ObjIsNode(pObj) )
            Counter += (Au_ObjSuppSize(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Au_NtkNodeNum(p) );
    return Counter;
}